

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-visitor.cc
# Opt level: O2

void __thiscall
wabt::ExprVisitor::PushExprlist(ExprVisitor *this,State state,Expr *expr,ExprList *expr_list)

{
  State local_34;
  Expr *local_30;
  iterator local_28;
  
  local_34 = state;
  local_30 = expr;
  std::vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>>::
  emplace_back<wabt::ExprVisitor::State&>
            ((vector<wabt::ExprVisitor::State,std::allocator<wabt::ExprVisitor::State>> *)
             &this->state_stack_,&local_34);
  std::vector<wabt::Expr*,std::allocator<wabt::Expr*>>::emplace_back<wabt::Expr*&>
            ((vector<wabt::Expr*,std::allocator<wabt::Expr*>> *)&this->expr_stack_,&local_30);
  local_28.node_ = expr_list->first_;
  local_28.list_ = expr_list;
  std::
  vector<wabt::intrusive_list<wabt::Expr>::iterator,_std::allocator<wabt::intrusive_list<wabt::Expr>::iterator>_>
  ::emplace_back<wabt::intrusive_list<wabt::Expr>::iterator>(&this->expr_iter_stack_,&local_28);
  return;
}

Assistant:

void ExprVisitor::PushExprlist(State state, Expr* expr, ExprList& expr_list) {
  state_stack_.emplace_back(state);
  expr_stack_.emplace_back(expr);
  expr_iter_stack_.emplace_back(expr_list.begin());
}